

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void Con_SaveConfig(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  char *format;
  long in_FS_OFFSET;
  char aDate [20];
  char aFilename [128];
  char *pcVar3;
  
  pcVar3 = aDate;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResult->m_NumArgs == 0) {
    str_timestamp(aDate,0x14);
    format = "configs/config_%s.cfg";
  }
  else {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
    format = "configs/%s.cfg";
  }
  str_format(aFilename,0x80,format,pcVar3);
  (**(code **)(*pUserData + 0x28))(pUserData,aFilename);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Con_SaveConfig(IConsole::IResult *pResult, void *pUserData)
{
	char aFilename[128];
	if(pResult->NumArguments())
		str_format(aFilename, sizeof(aFilename), "configs/%s.cfg", pResult->GetString(0));
	else
	{
		char aDate[20];
		str_timestamp(aDate, sizeof(aDate));
		str_format(aFilename, sizeof(aFilename), "configs/config_%s.cfg", aDate);
	}
	((CConfigManager *)pUserData)->Save(aFilename);
}